

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.cpp
# Opt level: O0

RefToken antlr::CommonToken::factory(void)

{
  TokenRefCount<antlr::Token> *this;
  Token *in_RDI;
  CommonToken *in_stack_fffffffffffffff0;
  
  this = (TokenRefCount<antlr::Token> *)operator_new(0x40);
  CommonToken(in_stack_fffffffffffffff0);
  TokenRefCount<antlr::Token>::TokenRefCount(this,in_RDI);
  return (RefToken)(TokenRef *)in_RDI;
}

Assistant:

RefToken CommonToken::factory()
{
	return RefToken(new CommonToken);
}